

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall google::protobuf::internal::ExtensionSet::Clear(ExtensionSet *this)

{
  KeyValue *pKVar1;
  long lVar2;
  
  pKVar1 = (this->map_).flat;
  if (this->flat_capacity_ < 0x101) {
    if (this->flat_size_ != 0) {
      lVar2 = (ulong)this->flat_size_ << 5;
      do {
        Extension::Clear(&pKVar1->second);
        pKVar1 = (KeyValue *)(&pKVar1->second + 1);
        lVar2 = lVar2 + -0x20;
      } while (lVar2 != 0);
    }
    return;
  }
  ForEach<std::_Rb_tree_iterator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,google::protobuf::internal::ExtensionSet::Clear()::__0>
            ((pKVar1->second).descriptor,&pKVar1->second);
  return;
}

Assistant:

void ExtensionSet::Clear() {
  ForEach([](int /* number */, Extension& ext) { ext.Clear(); });
}